

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curi.c
# Opt level: O2

curi_status parse_path(char *uri,size_t len,size_t *offset,curi_settings *settings,void *userData)

{
  char *path;
  ulong uVar1;
  curi_status cVar2;
  char *pcVar3;
  ulong uVar4;
  size_t initialOffset_1;
  size_t sVar5;
  size_t initialOffset;
  
  uVar1 = *offset;
  path = uri + uVar1;
  pcVar3 = "";
  if (uVar1 < len) {
    pcVar3 = path;
  }
  sVar5 = uVar1 + 1;
  *offset = sVar5;
  if (*pcVar3 == '/') {
    cVar2 = parse_segment(uri,len,offset,settings,userData,1);
    if (cVar2 == curi_status_success) {
      cVar2 = parse_segments(uri,len,offset,settings,userData);
      if (cVar2 != curi_status_success) {
        return cVar2;
      }
      sVar5 = *offset;
    }
    else {
      if (cVar2 != curi_status_error) {
        return cVar2;
      }
      *offset = sVar5;
    }
    cVar2 = handle_path(path,sVar5 - uVar1,settings,userData);
    if (cVar2 != curi_status_error) {
      return cVar2;
    }
  }
  *offset = uVar1;
  cVar2 = parse_segment(uri,len,offset,settings,userData,1);
  if (cVar2 == curi_status_success) {
    cVar2 = parse_segments(uri,len,offset,settings,userData);
    if (cVar2 != curi_status_success) {
      return cVar2;
    }
    uVar4 = *offset;
  }
  else {
    if (cVar2 != curi_status_error) {
      return cVar2;
    }
    *offset = uVar1;
    uVar4 = uVar1;
  }
  cVar2 = handle_path(path,uVar4 - uVar1,settings,userData);
  if (cVar2 == curi_status_error) {
    *offset = uVar1;
    cVar2 = curi_status_success;
  }
  return cVar2;
}

Assistant:

static curi_status parse_path(const char* uri, size_t len, size_t* offset, const curi_settings* settings, void* userData)
{
    // path = path-absolute
    //      / path-relative
    //      / path-empty
    curi_status status = curi_status_error;

    if (status == curi_status_error)
        TRY(status,offset,parse_path_absolute(uri, len, offset, settings, userData));

    if (status == curi_status_error)
        TRY(status,offset,parse_path_relative(uri, len, offset, settings, userData));

    if (status == curi_status_error)
        TRY(status,offset,parse_path_empty(uri, len, offset, settings, userData));

    return status;
}